

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O1

void If_ManComputeRequired(If_Man_t *p)

{
  int iVar1;
  If_Par_t *pIVar2;
  float *pfVar3;
  uint *puVar4;
  void **ppvVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  If_Man_t *pIVar8;
  long lVar9;
  uint iCo;
  uint uVar10;
  char *in_RSI;
  char *pcVar11;
  Tim_Man_t *p_00;
  If_Man_t *pIVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  
  pIVar12 = p;
  If_ManMarkMapping(p);
  if (p->pManTim == (Tim_Man_t *)0x0) {
    pfVar3 = p->pPars->pTimesReq;
    if ((pfVar3 == (float *)0x0) || (p->pPars->fAreaOnly != 0)) {
      in_RSI = (char *)0x0;
      pIVar12 = p;
      fVar16 = If_ManDelayMax(p,0);
      p->RequiredGlo = fVar16;
      pIVar2 = p->pPars;
      if ((pIVar2->nRelaxRatio != 0) &&
         ((pIVar2->DelayTargetNew == 0.0 && (!NAN(pIVar2->DelayTargetNew))))) {
        pIVar2->DelayTargetNew = (((float)pIVar2->nRelaxRatio + 100.0) * fVar16) / 100.0;
      }
      fVar17 = pIVar2->DelayTarget;
      if ((fVar17 != -1.0) || (NAN(fVar17))) {
        if (fVar16 <= fVar17 + p->fEpsilon) {
          if (fVar16 < fVar17 - p->fEpsilon) {
            if (p->fNextRound == 0) {
              p->fNextRound = 1;
            }
            p->RequiredGlo = fVar17;
          }
        }
        else if (p->fNextRound == 0) {
          p->fNextRound = 1;
          in_RSI = "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n";
          Abc_Print((int)pIVar12,
                    "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                    (double)fVar17);
        }
      }
      else if (0.0 < pIVar2->DelayTargetNew) {
        p->RequiredGlo = pIVar2->DelayTargetNew;
      }
      pIVar2 = p->pPars;
      if (pIVar2->fAreaOnly != 0) {
        return;
      }
      if (pIVar2->fDoAverage == 0) {
        if (pIVar2->fLatchPaths == 0) {
          lVar15 = (long)p->vCos->nSize;
          if (0 < lVar15) {
            ppvVar5 = p->vCos->pArray;
            fVar16 = p->RequiredGlo;
            lVar9 = 0;
            do {
              in_RSI = *(char **)((long)ppvVar5[lVar9] + 0x18);
              ((If_Obj_t *)in_RSI)->Required = fVar16;
              lVar9 = lVar9 + 1;
            } while (lVar15 != lVar9);
          }
        }
        else {
          uVar10 = p->nObjs[3] - pIVar2->nLatchesCo;
          pVVar7 = p->vCos;
          iVar1 = pVVar7->nSize;
          if ((int)uVar10 < iVar1) {
            in_RSI = (char *)(ulong)uVar10;
            do {
              if ((int)uVar10 < 0) goto LAB_003b88d3;
              *(float *)(*(long *)((long)pVVar7->pArray[(long)in_RSI] + 0x18) + 0x34) =
                   p->RequiredGlo;
              in_RSI = (char *)((long)in_RSI + 1);
            } while ((int)in_RSI < iVar1);
          }
        }
      }
      else {
        iVar1 = pIVar2->nRelaxRatio;
        pVVar7 = p->vCos;
        uVar10 = pVVar7->nSize;
        if (iVar1 == 0) {
          if (0 < (int)uVar10) {
            ppvVar5 = pVVar7->pArray;
            uVar14 = 0;
            do {
              in_RSI = *(char **)((long)ppvVar5[uVar14] + 0x18);
              ((If_Obj_t *)in_RSI)->Required = (((If_Obj_t *)in_RSI)->CutBest).Delay;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
        }
        else if (0 < (int)uVar10) {
          ppvVar5 = pVVar7->pArray;
          uVar14 = 0;
          do {
            in_RSI = *(char **)((long)ppvVar5[uVar14] + 0x18);
            ((If_Obj_t *)in_RSI)->Required =
                 ((((If_Obj_t *)in_RSI)->CutBest).Delay * ((float)iVar1 + 100.0)) / 100.0;
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
      }
    }
    else {
      pIVar8 = (If_Man_t *)(long)p->vCos->nSize;
      if ((long)pIVar8 < 1) {
        uVar14 = 0;
      }
      else {
        in_RSI = (char *)p->vCos->pArray;
        fVar16 = p->fEpsilon;
        pIVar12 = (If_Man_t *)0x0;
        uVar14 = 0;
        do {
          lVar15 = *(long *)(*(long *)(&((If_Obj_t *)in_RSI)->field_0x0 + (long)pIVar12 * 8) + 0x18)
          ;
          fVar17 = pfVar3[(long)pIVar12];
          if (*(float *)(lVar15 + 0x5c) <= fVar17 + fVar16) {
            *(float *)(lVar15 + 0x34) = fVar17;
          }
          else {
            *(float *)(lVar15 + 0x34) = *(float *)(lVar15 + 0x5c);
            uVar14 = (ulong)((int)uVar14 + 1);
          }
          pIVar12 = (If_Man_t *)((long)&pIVar12->pName + 1);
        } while (pIVar8 != pIVar12);
      }
      if (((int)uVar14 != 0) && (p->fReqTimeWarn == 0)) {
        pcVar11 = "";
        if (1 < (int)uVar14) {
          pcVar11 = "s";
        }
        in_RSI = 
        "Required times are exceeded at %d output%s. The earliest arrival times are used.\n";
        Abc_Print((int)pIVar12,
                  "Required times are exceeded at %d output%s. The earliest arrival times are used.\n"
                  ,uVar14,pcVar11);
        p->fReqTimeWarn = 1;
      }
    }
    pVVar7 = p->vObjsRev;
    if (0 < pVVar7->nSize) {
      lVar15 = 0;
      do {
        pvVar6 = pVVar7->pArray[lVar15];
        if (*(int *)((long)pvVar6 + 0xc) != 0) {
          If_CutPropagateRequired
                    (p,(If_Obj_t *)in_RSI,(If_Cut_t *)((long)pvVar6 + 0x50),
                     *(float *)((long)pvVar6 + 0x34));
        }
        lVar15 = lVar15 + 1;
        pVVar7 = p->vObjsRev;
      } while (lVar15 < pVVar7->nSize);
    }
  }
  else {
    pcVar11 = (char *)0x0;
    pIVar12 = p;
    fVar16 = If_ManDelayMax(p,0);
    p->RequiredGlo = fVar16;
    pIVar2 = p->pPars;
    if (((pIVar2->nRelaxRatio != 0) && (pIVar2->DelayTargetNew == 0.0)) &&
       (!NAN(pIVar2->DelayTargetNew))) {
      pIVar2->DelayTargetNew = (((float)pIVar2->nRelaxRatio + 100.0) * fVar16) / 100.0;
    }
    fVar17 = pIVar2->DelayTarget;
    if ((fVar17 != -1.0) || (NAN(fVar17))) {
      if (fVar16 <= fVar17 + p->fEpsilon) {
        if (fVar16 < fVar17 - p->fEpsilon) {
          if (p->fNextRound == 0) {
            p->fNextRound = 1;
          }
          p->RequiredGlo = fVar17;
        }
      }
      else if (p->fNextRound == 0) {
        p->fNextRound = 1;
        pcVar11 = "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n";
        Abc_Print((int)pIVar12,
                  "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                  (double)fVar17);
      }
    }
    else if (0.0 < pIVar2->DelayTargetNew) {
      p->RequiredGlo = pIVar2->DelayTargetNew;
    }
    if (p->pPars->fAreaOnly == 0) {
      Tim_ManIncrementTravId(p->pManTim);
      if (p->vCoAttrs == (Vec_Int_t *)0x0) {
        pIVar2 = p->pPars;
        if (pIVar2->fDoAverage == 0) {
          if (pIVar2->fLatchPaths == 0) {
            Tim_ManInitPoRequiredAll(p->pManTim,p->RequiredGlo);
          }
          else {
            uVar10 = pIVar2->nLatchesCoBox;
            uVar13 = p->nObjs[3] - p->pPars->nLatchesCo;
            iCo = uVar10;
            if ((int)uVar10 < (int)uVar13) {
              do {
                if (((int)uVar10 < 0) || (p->vCos->nSize <= (int)iCo)) goto LAB_003b88d3;
                pcVar11 = (char *)(ulong)iCo;
                Tim_ManSetCoRequired(p->pManTim,iCo,1e+20);
                iCo = iCo + 1;
                uVar13 = p->nObjs[3] - p->pPars->nLatchesCo;
              } while ((int)iCo < (int)uVar13);
            }
            uVar10 = uVar13;
            if ((int)uVar13 < p->vCos->nSize) {
              do {
                pcVar11 = (char *)(ulong)uVar10;
                if ((int)uVar13 < 0) {
LAB_003b88d3:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                Tim_ManSetCoRequired(p->pManTim,uVar10,p->RequiredGlo);
                uVar10 = uVar10 + 1;
              } while ((int)uVar10 < p->vCos->nSize);
            }
          }
        }
        else {
          pVVar7 = p->vCos;
          if (pIVar2->nRelaxRatio == 0) {
            if (0 < pVVar7->nSize) {
              uVar14 = 0;
              do {
                pcVar11 = (char *)(uVar14 & 0xffffffff);
                Tim_ManSetCoRequired
                          (p->pManTim,(int)uVar14,
                           *(float *)(*(long *)((long)pVVar7->pArray[uVar14] + 0x18) + 0x5c));
                uVar14 = uVar14 + 1;
                pVVar7 = p->vCos;
              } while ((long)uVar14 < (long)pVVar7->nSize);
            }
          }
          else if (0 < pVVar7->nSize) {
            uVar14 = 0;
            do {
              pcVar11 = (char *)(uVar14 & 0xffffffff);
              Tim_ManSetCoRequired
                        (p->pManTim,(int)uVar14,
                         (((float)p->pPars->nRelaxRatio + 100.0) *
                         *(float *)(*(long *)((long)pVVar7->pArray[uVar14] + 0x18) + 0x5c)) / 100.0)
              ;
              uVar14 = uVar14 + 1;
              pVVar7 = p->vCos;
            } while ((long)uVar14 < (long)pVVar7->nSize);
          }
        }
      }
      else {
        if (p->nObjs[3] != p->vCoAttrs->nSize) {
          __assert_fail("If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                        ,0x1c3,"void If_ManComputeRequired(If_Man_t *)");
        }
        pVVar7 = p->vCos;
        if (0 < pVVar7->nSize) {
          uVar14 = 0;
          do {
            if ((long)p->vCoAttrs->nSize <= (long)uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            switch(p->vCoAttrs->pArray[uVar14]) {
            case 0:
              p_00 = p->pManTim;
              fVar16 = p->RequiredGlo;
              break;
            case 1:
              p_00 = p->pManTim;
              fVar16 = *(float *)(*(long *)((long)pVVar7->pArray[uVar14] + 0x18) + 0x5c);
              break;
            case 2:
              p_00 = p->pManTim;
              fVar16 = 1e+20;
              break;
            case -1:
              goto switchD_003b83e1_caseD_ffffffff;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                            ,0x1ce,"void If_ManComputeRequired(If_Man_t *)");
            }
            pcVar11 = (char *)(uVar14 & 0xffffffff);
            Tim_ManSetCoRequired(p_00,(int)uVar14,fVar16);
switchD_003b83e1_caseD_ffffffff:
            uVar14 = uVar14 + 1;
            pVVar7 = p->vCos;
          } while ((long)uVar14 < (long)pVVar7->nSize);
        }
      }
      pVVar7 = p->vObjsRev;
      if (0 < pVVar7->nSize) {
        lVar15 = 0;
        do {
          puVar4 = (uint *)pVVar7->pArray[lVar15];
          switch(*puVar4 & 0xf) {
          case 1:
            break;
          case 2:
            pcVar11 = (char *)(ulong)puVar4[2];
            Tim_ManSetCiRequired(p->pManTim,puVar4[2],(float)puVar4[0xd]);
            break;
          case 3:
            pcVar11 = (char *)(ulong)puVar4[2];
            fVar17 = Tim_ManGetCoRequired(p->pManTim,puVar4[2]);
            fVar16 = *(float *)(*(long *)(puVar4 + 6) + 0x34);
            if (fVar16 <= fVar17) {
              fVar17 = fVar16;
            }
            *(float *)(*(long *)(puVar4 + 6) + 0x34) = fVar17;
            break;
          case 4:
            if (puVar4[3] != 0) {
              If_CutPropagateRequired
                        (p,(If_Obj_t *)pcVar11,(If_Cut_t *)(puVar4 + 0x14),(float)puVar4[0xd]);
            }
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                          ,0x202,"void If_ManComputeRequired(If_Man_t *)");
          }
          lVar15 = lVar15 + 1;
          pVVar7 = p->vObjsRev;
        } while (lVar15 < pVVar7->nSize);
      }
    }
  }
  return;
}

Assistant:

void If_ManComputeRequired( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter;
    float reqTime;

    // compute area, clean required times, collect nodes used in the mapping
//    p->AreaGlo = If_ManScanMapping( p );
    If_ManMarkMapping( p );
    if ( p->pManTim == NULL )
    {
        // consider the case when the required times are given
        if ( p->pPars->pTimesReq && !p->pPars->fAreaOnly )
        {
            // make sure that the required time hold
            Counter = 0;
            If_ManForEachCo( p, pObj, i )
            {
                if ( If_ObjArrTime(If_ObjFanin0(pObj)) > p->pPars->pTimesReq[i] + p->fEpsilon )
                {
                    If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                    Counter++;
    //                Abc_Print( 0, "Required times are violated for output %d (arr = %d; req = %d).\n", 
    //                    i, (int)If_ObjArrTime(If_ObjFanin0(pObj)), (int)p->pPars->pTimesReq[i] );
                }
                else
                    If_ObjFanin0(pObj)->Required = p->pPars->pTimesReq[i];
            }
            if ( Counter && !p->fReqTimeWarn )
            {
                Abc_Print( 0, "Required times are exceeded at %d output%s. The earliest arrival times are used.\n", Counter, Counter > 1 ? "s":"" );
                p->fReqTimeWarn = 1;
            }
        }
        else
        {
            // get the global required times
            p->RequiredGlo = If_ManDelayMax( p, 0 );

            // find new delay target
            if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
                p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

            // update the required times according to the target
            if ( p->pPars->DelayTarget != -1 )
            {
                if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
                        Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                    }
                }
                else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
//                        Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                    }
                    p->RequiredGlo = p->pPars->DelayTarget;
                }
            }
            else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
                p->RequiredGlo = p->pPars->DelayTargetNew;
            // do not propagate required times if area minimization is requested
            if ( p->pPars->fAreaOnly ) 
                return;
            // set the required times for the POs
            if ( p->pPars->fDoAverage )
            {
                if ( p->pPars->nRelaxRatio )
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0;
                }
                else
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                }
            }
            else if ( p->pPars->fLatchPaths )
            {
                If_ManForEachLatchInput( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
            else 
            {
                If_ManForEachCo( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
        }
        // go through the nodes in the reverse topological order
    //    Vec_PtrForEachEntry( If_Obj_t *, p->vMapped, pObj, i )
    //        If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( pObj->nRefs == 0 )
                continue;
            If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        }
    }
    else
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // find new delay target
        if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
            p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

        // update the required times according to the target
        if ( p->pPars->DelayTarget != -1 )
        {
            if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
                    Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                }
            }
            else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
//                    Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                }
                p->RequiredGlo = p->pPars->DelayTarget;
            }
        }
        else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
            p->RequiredGlo = p->pPars->DelayTargetNew;

        // do not propagate required times if area minimization is requested
        if ( p->pPars->fAreaOnly ) 
            return;
        // set the required times for the POs
        Tim_ManIncrementTravId( p->pManTim );
        if ( p->vCoAttrs )
        {
            assert( If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs) );
            If_ManForEachCo( p, pObj, i )
            { 
                if ( Vec_IntEntry(p->vCoAttrs, i) == -1 )       // -1=internal
                    continue;
                if ( Vec_IntEntry(p->vCoAttrs, i) == 0 )        //  0=optimize
                    Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 1 )   //  1=keep
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 2 )   //  2=relax
                    Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
                else assert( 0 );
            }
        }
        else if ( p->pPars->fDoAverage )
        {
            if ( p->pPars->nRelaxRatio )
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0 );
            }
            else
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
            }
        }
        else if ( p->pPars->fLatchPaths )
        {
            If_ManForEachPo( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
            If_ManForEachLatchInput( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
        }
        else  
        {
            Tim_ManInitPoRequiredAll( p->pManTim, p->RequiredGlo );
//            If_ManForEachCo( p, pObj, i )
//                Tim_ManSetCoRequired( p->pManTim, pObj->IdPio, p->RequiredGlo );
        }
        // go through the nodes in the reverse topological order
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( If_ObjIsAnd(pObj) )
            {
                if ( pObj->nRefs == 0 )
                    continue;
                If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
            }
            else if ( If_ObjIsCi(pObj) )
            {
                reqTime = pObj->Required;
                Tim_ManSetCiRequired( p->pManTim, pObj->IdPio, reqTime );
            }
            else if ( If_ObjIsCo(pObj) )
            {
                reqTime = Tim_ManGetCoRequired( p->pManTim, pObj->IdPio );
                If_ObjFanin0(pObj)->Required = IF_MIN( reqTime, If_ObjFanin0(pObj)->Required );
            }
            else if ( If_ObjIsConst1(pObj) )
            {
            }
            else // add the node to the mapper
                assert( 0 );
        }
    }
}